

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::Generators::Generators<arg_res_tuple<long_double,_1UL>_>::populate
          (Generators<arg_res_tuple<long_double,_1UL>_> *this,arg_res_tuple<long_double,_1UL> *val)

{
  long lVar1;
  long lVar2;
  long lVar3;
  pointer *__ptr;
  GeneratorWrapper<arg_res_tuple<long_double,_1UL>_> local_18;
  
  local_18.m_generator._M_t.
  super___uniq_ptr_impl<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_*,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
  .super__Head_base<0UL,_Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_*,_false>.
  _M_head_impl = (unique_ptr<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
                  )operator_new(0x30);
  *(undefined ***)
   local_18.m_generator._M_t.
   super___uniq_ptr_impl<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_*,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
   .super__Head_base<0UL,_Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_*,_false>.
   _M_head_impl = &PTR__GeneratorUntypedBase_00318a08;
  lVar1 = *(long *)((long)(val->x).super_array<long_double,_1UL>._M_elems + 8);
  lVar2 = *(long *)&val->y;
  lVar3 = *(long *)((long)&val->y + 8);
  *(long *)((long)local_18.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_*,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_*,_false>
                  ._M_head_impl + 0x10) = *(long *)(val->x).super_array<long_double,_1UL>._M_elems;
  *(long *)((long)local_18.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_*,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_*,_false>
                  ._M_head_impl + 0x18) = lVar1;
  *(long *)((long)local_18.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_*,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_*,_false>
                  ._M_head_impl + 0x20) = lVar2;
  *(long *)((long)local_18.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_*,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_*,_false>
                  ._M_head_impl + 0x28) = lVar3;
  std::
  vector<Catch::Generators::GeneratorWrapper<arg_res_tuple<long_double,1ul>>,std::allocator<Catch::Generators::GeneratorWrapper<arg_res_tuple<long_double,1ul>>>>
  ::emplace_back<Catch::Generators::GeneratorWrapper<arg_res_tuple<long_double,1ul>>>
            ((vector<Catch::Generators::GeneratorWrapper<arg_res_tuple<long_double,1ul>>,std::allocator<Catch::Generators::GeneratorWrapper<arg_res_tuple<long_double,1ul>>>>
              *)&this->m_generators,&local_18);
  if (local_18.m_generator._M_t.
      super___uniq_ptr_impl<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_*,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
      .
      super__Head_base<0UL,_Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_18.m_generator._M_t.
                          super___uniq_ptr_impl<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_*,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
                          .
                          super__Head_base<0UL,_Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  return;
}

Assistant:

void populate(T&& val) {
            m_generators.emplace_back(value(std::forward<T>(val)));
        }